

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_DeletePropertyScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
              ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags)

{
  ushort uVar1;
  JavascriptLibrary *this;
  BOOL BVar2;
  int value;
  RecyclableObject *pRVar3;
  JavascriptBoolean *pJVar4;
  Var pvVar5;
  uint index;
  
  uVar1 = pScope->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      pRVar3 = (RecyclableObject *)FrameDisplay::GetItem(pScope,index);
      BVar2 = HasProperty(pRVar3,propertyId);
      if (BVar2 != 0) {
        this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
        value = (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x21])
                          (pRVar3,(ulong)(uint)propertyId,(ulong)propertyOperationFlags);
        pJVar4 = JavascriptLibrary::CreateBoolean(this,value);
        return pJVar4;
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  pRVar3 = VarTo<Js::RecyclableObject>(defaultInstance);
  pvVar5 = OP_DeleteRootProperty(pRVar3,propertyId,scriptContext,propertyOperationFlags);
  return pvVar5;
}

Assistant:

Var JavascriptOperators::OP_DeletePropertyScoped(
        FrameDisplay *pScope,
        PropertyId propertyId,
        Var defaultInstance,
        ScriptContext* scriptContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeletePropertyScoped);
        JIT_HELPER_SAME_ATTRIBUTES(Op_DeleteRootProperty, Op_DeletePropertyScoped);
        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(i);
            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                return scriptContext->GetLibrary()->CreateBoolean(JavascriptOperators::DeleteProperty(obj, propertyId, propertyOperationFlags));
            }
        }

        return JavascriptOperators::OP_DeleteRootProperty(VarTo<RecyclableObject>(defaultInstance), propertyId, scriptContext, propertyOperationFlags);
        JIT_HELPER_END(Op_DeletePropertyScoped);
    }